

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

int sort_typeBstar(uchar *T,int *SA,int *bucket_A,int *bucket_B,int n,int openMP)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint *puVar9;
  uint *puVar10;
  uint *puVar11;
  uint *puVar12;
  uint uVar13;
  int *piVar14;
  ulong uVar15;
  uint *puVar16;
  uint *puVar17;
  long lVar18;
  ushort uVar19;
  uint uVar20;
  int *piVar21;
  ulong uVar22;
  ulong uVar23;
  uint *puVar24;
  long lVar25;
  uchar *puVar26;
  int iVar27;
  uint *puVar28;
  uint uVar29;
  undefined4 in_register_00000084;
  uint *puVar30;
  int iVar31;
  byte bVar32;
  int *piVar33;
  uint *puVar34;
  uint *unaff_R15;
  int in_stack_fffffffffffff6a0;
  uint *local_958;
  ulong local_950;
  int local_948;
  uint *local_940;
  uint *local_908;
  uint *local_8f0;
  uint *local_8e8;
  uint *local_8e0;
  uint *local_8d8;
  long local_8d0;
  ulong local_8c8;
  uint *local_8c0;
  uint *local_8b8;
  ulong local_8b0;
  ulong local_8a8;
  uint *local_8a0;
  int local_894;
  undefined8 local_890;
  int *local_888;
  ulong local_880;
  long local_878;
  uint *local_870;
  long local_868;
  int local_85c;
  int *local_858;
  trbudget_t local_850;
  ulong local_840;
  anon_struct_32_5_90aca025 stack [64];
  
  local_890 = CONCAT44(in_register_00000084,n);
  for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
    bucket_A[lVar8] = 0;
  }
  for (lVar8 = 0; lVar8 != 0x10000; lVar8 = lVar8 + 1) {
    bucket_B[lVar8] = 0;
  }
  uVar15 = (ulong)(n - 1);
  uVar23 = uVar15;
  uVar13 = (uint)T[uVar15];
  iVar5 = n;
LAB_001792bb:
  if (-1 < (int)uVar23) {
    uVar20 = -(int)uVar23;
    uVar29 = uVar13;
    do {
      uVar13 = uVar29;
      bucket_A[uVar13] = bucket_A[uVar13] + 1;
      if (uVar23 == 0) {
        uVar23 = 0xffffffff;
        goto LAB_001792bb;
      }
      uVar29 = (uint)T[uVar23 - 1];
      uVar20 = uVar20 + 1;
      uVar23 = uVar23 - 1;
    } while (uVar13 <= uVar29);
    bucket_B[uVar29 << 8 | uVar13] = bucket_B[uVar29 << 8 | uVar13] + 1;
    lVar8 = (long)iVar5;
    iVar5 = iVar5 + -1;
    SA[lVar8 + -1] = -uVar20;
    for (uVar20 = ~uVar20; uVar23 = (ulong)uVar20, -1 < (int)uVar20; uVar20 = uVar20 - 1) {
      bVar32 = T[uVar23];
      uVar13 = (uint)bVar32;
      if (uVar29 < bVar32) goto LAB_001792bb;
      bucket_B[uVar29 << 8 | (uint)bVar32] = bucket_B[uVar29 << 8 | (uint)bVar32] + 1;
      uVar29 = (uint)bVar32;
    }
    uVar23 = 0xffffffff;
    uVar13 = uVar29;
    goto LAB_001792bb;
  }
  piVar14 = bucket_B + 1;
  piVar21 = bucket_B + 0x100;
  iVar31 = 0;
  iVar27 = 0;
  for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
    iVar2 = bucket_A[lVar8];
    bucket_A[lVar8] = iVar27 + iVar31;
    iVar27 = iVar2 + iVar27 + bucket_B[lVar8 * 0x101];
    piVar33 = piVar21;
    for (lVar25 = 1; lVar8 + lVar25 != 0x100; lVar25 = lVar25 + 1) {
      iVar31 = iVar31 + piVar14[lVar25 + -1];
      piVar14[lVar25 + -1] = iVar31;
      iVar27 = iVar27 + *piVar33;
      piVar33 = piVar33 + 0x100;
    }
    piVar14 = piVar14 + 0x101;
    piVar21 = piVar21 + 0x101;
  }
  local_8c0._0_4_ = n - iVar5;
  puVar9 = (uint *)(ulong)(uint)local_8c0;
  if ((uint)local_8c0 != 0 && iVar5 <= n) {
    piVar14 = SA + ((ulong)(uint)n - (long)puVar9);
    for (uVar13 = (uint)local_8c0 - 2; -1 < (int)uVar13; uVar13 = uVar13 - 1) {
      uVar19 = *(ushort *)(T + piVar14[uVar13]) << 8 | *(ushort *)(T + piVar14[uVar13]) >> 8;
      iVar5 = bucket_B[uVar19];
      bucket_B[uVar19] = iVar5 + -1;
      SA[(long)iVar5 + -1] = uVar13;
    }
    puVar28 = (uint *)(SA + (long)puVar9);
    local_880 = (ulong)((uint)local_8c0 - 1);
    uVar19 = *(ushort *)(T + piVar14[local_880]) << 8 | *(ushort *)(T + piVar14[local_880]) >> 8;
    iVar5 = bucket_B[uVar19];
    bucket_B[uVar19] = iVar5 + -1;
    SA[(long)iVar5 + -1] = (uint)local_8c0 - 1;
    iVar5 = n + (uint)local_8c0 * -2;
    local_8d8 = (uint *)CONCAT44(local_8d8._4_4_,iVar5);
    local_870 = (uint *)(long)iVar5;
    local_8b8 = (uint *)CONCAT44(local_8b8._4_4_,n + -2);
    local_8a8 = CONCAT44(local_8a8._4_4_,0xfe);
    local_8c0 = puVar9;
    local_8b0 = uVar15;
    local_888 = bucket_A;
    while (0 < (int)puVar9) {
      local_868 = CONCAT44(local_868._4_4_,(int)local_8a8 << 8);
      uVar13 = 0xff;
      while ((int)local_8a8 < (int)uVar13) {
        local_878 = CONCAT44(local_878._4_4_,uVar13);
        uVar13 = bucket_B[(int)(uVar13 | (uint)local_868)];
        iVar5 = (int)puVar9;
        puVar9 = (uint *)(ulong)uVar13;
        if (1 < (int)(iVar5 - uVar13)) {
          puVar34 = (uint *)(SA + (int)uVar13);
          uVar29 = *puVar34;
          local_8e8 = (uint *)(SA + (long)(int)uVar13 + 1);
          puVar16 = puVar34;
          if (uVar29 == (uint)local_880) {
            puVar16 = local_8e8;
          }
          puVar12 = (uint *)(SA + iVar5);
          local_8d0 = CONCAT71(local_8d0._1_7_,1);
          local_8c8 = CONCAT44(local_8c8._4_4_,uVar13);
          local_958 = puVar12;
          local_908 = puVar28;
          local_948 = (int)local_8d8;
          if ((int)local_8d8 < 0x400) {
            uVar15 = (long)puVar12 - (long)puVar16 >> 2;
            if ((long)local_870 < (long)uVar15) {
              iVar5 = 0x400;
              uVar13 = (uint)uVar15;
              if ((int)uVar13 < 0x100000) {
                if (uVar13 < 0x10000) {
                  if (uVar13 < 0x100) {
                    uVar20 = lg_table[uVar15 & 0xff];
                  }
                  else {
                    uVar20 = lg_table[uVar15 >> 8 & 0xff] + 8;
                  }
                }
                else if (uVar13 < 0x1000000) {
                  uVar20 = *(int *)((long)lg_table + (ulong)(uVar13 >> 0xe & 0x3fc)) + 0x10;
                }
                else {
                  uVar20 = lg_table[uVar13 >> 0x18] + 0x18;
                }
                if ((int)uVar20 < 0x10) {
                  if ((int)uVar20 < 8) {
                    iVar5 = sqq_table[(int)((ulong)((long)puVar12 - (long)puVar16) >> 2)] >> 4;
                    goto LAB_001796e7;
                  }
                  iVar5 = (sqq_table[(int)uVar13 >> (((byte)uVar20 & 0xfe) - 6 & 0x1f)] >>
                          (7U - (char)(uVar20 >> 1) & 0x1f)) + 1;
                }
                else {
                  iVar5 = sqq_table[(int)uVar13 >> (((byte)uVar20 & 0xfe) - 6 & 0x1f)] <<
                          ((char)(uVar20 >> 1) - 7U & 0x1f);
                  if (0x17 < uVar20) {
                    iVar5 = iVar5 + (int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 |
                                                uVar15 & 0xffffffff) / (long)iVar5) + 1 >> 1;
                  }
                  iVar5 = iVar5 + (int)((long)((ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 |
                                              uVar15 & 0xffffffff) / (long)iVar5) + 1 >> 1;
                }
                iVar5 = iVar5 - (uint)((int)uVar13 < iVar5 * iVar5);
              }
LAB_001796e7:
              if ((int)local_8d8 < iVar5) {
                local_948 = 0x400;
                if (iVar5 < 0x400) {
                  local_948 = iVar5;
                }
                local_8d0 = CONCAT71(local_8d0._1_7_,iVar5 == 0);
                local_958 = puVar12 + -(long)local_948;
                local_908 = puVar12 + -(long)local_948;
              }
            }
          }
          uVar13 = 0;
          puVar9 = puVar16;
          local_8a0 = puVar16;
          while (0x1000 < (long)local_958 - (long)puVar9) {
            puVar30 = puVar9 + 0x400;
            ss_mintrosort(T,piVar14,(int *)puVar9,(int *)puVar30,(int)puVar16);
            iVar5 = (int)((ulong)((long)puVar12 - (long)puVar30) >> 2);
            puVar11 = local_908;
            if (local_948 < iVar5) {
              puVar11 = puVar30;
            }
            if (iVar5 < local_948) {
              iVar5 = local_948;
            }
            iVar27 = 0x400;
            for (uVar20 = uVar13; (uVar20 & 1) != 0; uVar20 = uVar20 >> 1) {
              lVar8 = (long)iVar27;
              puVar16 = puVar9 + lVar8;
              ss_swapmerge(T,piVar14,(int *)(puVar9 + -lVar8),(int *)puVar9,(int *)puVar16,
                           (int *)puVar11,iVar5,in_stack_fffffffffffff6a0);
              iVar27 = iVar27 * 2;
              puVar9 = puVar9 + -lVar8;
            }
            uVar13 = uVar13 + 1;
            puVar9 = puVar30;
          }
          ss_mintrosort(T,piVar14,(int *)puVar9,(int *)local_958,(int)puVar16);
          iVar5 = 0x400;
          for (; uVar13 != 0; uVar13 = uVar13 >> 1) {
            puVar30 = puVar9;
            if ((uVar13 & 1) != 0) {
              puVar30 = puVar9 + -(long)iVar5;
              puVar16 = local_958;
              ss_swapmerge(T,piVar14,(int *)puVar30,(int *)puVar9,(int *)local_958,(int *)local_908,
                           local_948,in_stack_fffffffffffff6a0);
            }
            iVar5 = iVar5 * 2;
            puVar9 = puVar30;
          }
          puVar9 = (uint *)(local_8c8 & 0xffffffff);
          if ((char)local_8d0 == '\0') {
            ss_mintrosort(T,piVar14,(int *)local_958,(int *)puVar12,(int)puVar16);
            puVar16 = puVar12;
            do {
              uVar13 = puVar16[-1];
              uVar15 = (ulong)((long)local_958 - (long)local_8a0) >> 2;
              puVar9 = local_8a0;
              uVar20 = 0xffffffff;
              while (puVar30 = puVar9, uVar23 = local_8c8, uVar7 = (uint)uVar15, 0 < (int)uVar7) {
                uVar6 = (puVar30 + (ulong)(uVar7 >> 1) + 1)[-1];
                uVar6 = ss_compare(T,piVar14 + ((int)uVar6 >> 0x1f ^ uVar6),
                                   piVar14 + ((int)uVar13 >> 0x1f ^ uVar13),2);
                uVar15 = (ulong)((uVar7 >> 1) - (uVar6 >> 0x1f & ~uVar7));
                puVar9 = puVar30 + (ulong)(uVar7 >> 1) + 1;
                if (-1 < (int)uVar6) {
                  puVar9 = puVar30;
                  uVar20 = uVar6;
                }
              }
              if (puVar30 < local_958) {
                puVar9 = (uint *)(local_8c8 & 0xffffffff);
                if (uVar20 == 0) {
                  *puVar30 = ~*puVar30;
                }
                uVar22 = (ulong)((long)local_958 - (long)puVar30) >> 2;
                uVar15 = (ulong)((long)puVar16 - (long)local_958) >> 2;
                puVar11 = puVar16;
                puVar10 = puVar30;
LAB_00179979:
                uVar20 = (uint)uVar22;
                do {
                  if (((int)uVar20 < 1) || (uVar7 = (uint)uVar15, (int)uVar7 < 1)) {
LAB_00179a28:
                    if (puVar30 == local_8a0) goto LAB_00179a6e;
                    puVar16 = (uint *)((long)puVar16 - ((long)local_958 - (long)puVar30));
                    local_958 = puVar30;
                    break;
                  }
                  if (uVar20 == uVar7) {
                    ss_blockswap((int *)puVar10,(int *)local_958,uVar20);
                    goto LAB_00179a28;
                  }
                  if (uVar7 <= uVar20) goto LAB_001799c9;
                  do {
                    puVar11 = puVar11 + -1;
                    uVar7 = *puVar11;
                    puVar17 = local_958 + -1;
                    do {
                      *puVar11 = *puVar17;
                      puVar24 = puVar11 + -1;
                      puVar11 = puVar11 + -1;
                      *puVar17 = *puVar24;
                      puVar17 = puVar17 + -1;
                    } while (puVar10 <= puVar17);
                    *puVar11 = uVar7;
                    uVar7 = (int)uVar15 + ~uVar20;
                    uVar15 = (ulong)uVar7;
                  } while ((int)uVar20 < (int)uVar7);
                } while( true );
              }
              puVar9 = (uint *)(uVar23 & 0xffffffff);
              while (puVar16 = puVar16 + -1, (int)uVar13 < 0) {
                uVar13 = puVar16[-1];
              }
            } while (local_958 != puVar16);
          }
LAB_00179a6e:
          uVar15 = local_8b0;
          if (uVar29 == (uint)local_880) {
            uVar13 = *puVar34;
            stack[0].a._0_4_ = piVar14[(int)uVar13];
            stack[0].a._4_4_ = local_8b8._0_4_;
            for (puVar16 = local_8e8; puVar16 < puVar12; puVar16 = puVar16 + 1) {
              uVar29 = *puVar16;
              if ((-1 < (long)(int)uVar29) &&
                 (iVar5 = ss_compare(T,(int *)stack,piVar14 + (int)uVar29,2), iVar5 < 1)) break;
              puVar16[-1] = uVar29;
            }
            puVar16[-1] = uVar13;
            uVar15 = local_8b0;
          }
        }
        unaff_R15 = puVar9;
        uVar13 = (int)local_878 - 1;
      }
      local_8a8 = CONCAT44(local_8a8._4_4_,(int)local_8a8 + -1);
    }
    uVar23 = local_880;
    while (uVar13 = (uint)uVar23, -1 < (int)uVar13) {
      uVar29 = SA[uVar23 & 0xffffffff];
      if (-1 < (int)uVar29) {
        iVar5 = 0;
        uVar23 = uVar23 & 0xffffffff;
        do {
          uVar22 = uVar23;
          puVar28[uVar29] = uVar13 + iVar5;
          uVar23 = uVar22 - 1;
          if (uVar22 == 0) {
            *SA = ~uVar13;
            goto LAB_00179ba1;
          }
          uVar29 = SA[uVar23];
          iVar5 = iVar5 + -1;
        } while (-1 < (int)uVar29);
        SA[uVar22] = iVar5;
        if (uVar23 == 0) break;
        uVar13 = uVar13 + iVar5;
      }
      puVar9 = (uint *)(SA + (int)uVar13);
      uVar23 = (ulong)*puVar9;
      lVar8 = -1;
      do {
        puVar9[lVar8 + 1] = ~(uint)uVar23;
        puVar28[(int)~(uint)uVar23] = uVar13;
        uVar23 = (ulong)(int)puVar9[lVar8];
        lVar8 = lVar8 + -1;
      } while ((long)uVar23 < 0);
      puVar28[uVar23] = uVar13;
      uVar23 = (ulong)(uVar13 + (int)lVar8);
    }
LAB_00179ba1:
    iVar27 = (int)local_8c0;
    iVar5 = tr_ilg(iVar27);
    local_850.chance = (iVar5 * 2) / 3;
    local_8b8 = puVar28 + 1;
    local_85c = -iVar27;
    piVar14 = SA + 1;
    local_8d0 = -(long)SA;
    local_858 = piVar14;
    local_850.remain = iVar27;
    local_850.incval = iVar27;
LAB_00179bf9:
    uVar13 = *SA;
    if (local_85c < (int)uVar13) {
      local_840 = (long)local_8b8 - (long)puVar28;
      lVar8 = (long)(int)(local_840 >> 2);
      local_868 = -lVar8;
      uVar23 = 0;
      local_894 = 0;
      puVar9 = (uint *)SA;
LAB_00179c44:
      uVar29 = (uint)uVar23;
      if ((int)uVar13 < 0) {
        local_940 = puVar9 + -(long)(int)uVar13;
        uVar23 = (ulong)(uVar29 + uVar13);
      }
      else {
        if (uVar29 != 0) {
          puVar9[(int)uVar29] = uVar29;
        }
        local_940 = (uint *)(piVar14 + (int)puVar28[uVar13]);
        uVar23 = (long)local_940 - (long)puVar9;
        if (4 < (long)uVar23) {
          local_850.count = 0;
          iVar5 = tr_ilg((int)(uVar23 >> 2));
          local_950 = 0;
          uVar13 = 0xffffffff;
          puVar34 = puVar9;
          puVar16 = local_8b8;
          local_8d8 = local_940;
          local_870 = puVar9;
LAB_00179cab:
          local_8a8 = (long)local_940 - (long)puVar34;
          uVar15 = (long)local_8a8 >> 2;
          iVar27 = (int)uVar15;
          uVar29 = iVar27 - 1;
          local_8a0 = (uint *)CONCAT44(local_8a0._4_4_,(int)uVar29 / 2);
          local_8c8 = (ulong)((int)uVar29 / 2);
          local_878 = (long)(int)uVar29;
          puVar12 = local_940 + -1;
LAB_00179d11:
          uVar20 = (uint)local_950;
          puVar30 = (uint *)(long)(int)uVar20;
          if (iVar5 < 0) goto LAB_00179eb5;
          puVar11 = puVar34;
          if ((long)uVar15 < 9) goto LAB_00179d2a;
          if (iVar5 == 0) {
            uVar23 = uVar15 & 0xffffffff;
            iVar5 = (int)((long)((ulong)(uint)(iVar27 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) / 2);
            if ((uVar15 & 1) == 0) {
              uVar20 = puVar34[local_878];
              uVar23 = (ulong)uVar29;
              iVar5 = (int)local_8a0;
              if ((int)puVar16[(int)puVar34[local_8c8]] < (int)puVar16[(int)uVar20]) {
                puVar34[local_878] = puVar34[local_8c8];
                puVar34[local_8c8] = uVar20;
                uVar23 = (ulong)uVar29;
              }
            }
            while (iVar31 = (int)uVar23, 0 < iVar5) {
              iVar5 = iVar5 + -1;
              tr_fixdown((int *)puVar16,(int *)puVar34,iVar5,iVar31);
            }
            if ((uVar15 & 1) == 0) {
              uVar20 = *puVar34;
              *puVar34 = puVar34[iVar31];
              puVar34[iVar31] = uVar20;
              tr_fixdown((int *)puVar16,(int *)puVar34,0,iVar31);
            }
            uVar22 = (ulong)(iVar31 - 1);
            for (; unaff_R15 = puVar12, 1 < (int)uVar23; uVar23 = (ulong)((int)uVar23 - 1)) {
              uVar20 = *puVar34;
              *puVar34 = puVar34[uVar22];
              tr_fixdown((int *)puVar16,(int *)puVar34,0,(int)uVar22);
              puVar34[uVar22] = uVar20;
              uVar22 = uVar22 - 1;
            }
            while (puVar34 < unaff_R15) {
              uVar20 = puVar16[(int)*unaff_R15];
              puVar9 = unaff_R15;
              while ((puVar9 = puVar9 + -1, unaff_R15 = puVar9, puVar34 <= puVar9 &&
                     (puVar16[(int)*puVar9] == uVar20))) {
                *puVar9 = ~*puVar9;
              }
            }
            iVar5 = -3;
            goto LAB_00179d11;
          }
          uVar29 = (uint)(local_8a8 >> 2);
          puVar11 = puVar34 + (int)((long)((ulong)(uint)((int)uVar29 >> 0x1f) << 0x20 |
                                          local_8a8 >> 2 & 0xffffffff) / 2);
          if ((int)uVar29 < 0x201) {
            puVar10 = puVar34;
            local_8e8 = puVar30;
            local_8e0 = puVar9;
            if ((int)uVar29 < 0x21) goto LAB_0017a743;
            uVar23 = (ulong)(uint)((int)(local_8a8 >> 4) << 2);
            puVar17 = (uint *)((long)puVar12 - uVar23);
            uVar29 = *(uint *)((long)puVar34 + uVar23);
            puVar10 = (uint *)((long)puVar34 + uVar23);
            puVar24 = puVar11;
            if ((int)puVar16[(int)*puVar11] < (int)puVar16[(int)uVar29]) {
              puVar24 = puVar10;
              uVar29 = *puVar11;
              puVar10 = puVar11;
            }
            uVar7 = *puVar17;
            puVar11 = puVar12;
            if ((int)puVar16[(int)*puVar12] < (int)puVar16[(int)uVar7]) {
              puVar11 = puVar17;
              uVar7 = *puVar12;
              puVar17 = puVar12;
            }
            puVar12 = puVar11;
            if ((int)puVar16[(int)uVar7] < (int)puVar16[(int)uVar29]) {
              puVar12 = puVar24;
              puVar24 = puVar11;
              puVar17 = puVar10;
            }
            uVar29 = *puVar34;
            puVar11 = puVar24;
            local_8f0 = puVar34;
            if ((int)puVar16[(int)*puVar24] < (int)puVar16[(int)uVar29]) {
              puVar11 = puVar34;
              uVar29 = *puVar24;
              local_8f0 = puVar24;
            }
            if ((int)puVar16[(int)uVar29] <= (int)puVar16[(int)*puVar17]) {
              local_8f0 = puVar17;
              puVar12 = puVar11;
            }
            if ((int)puVar16[(int)*puVar12] <= (int)puVar16[(int)*local_8f0]) {
              local_8f0 = puVar12;
            }
          }
          else {
            uVar23 = local_8a8 >> 5 & 0x1fffffff;
            local_8e8 = puVar30;
            local_8e0 = puVar9;
            puVar10 = (uint *)tr_median3((int *)puVar16,(int *)puVar34,(int *)(puVar34 + uVar23),
                                         (int *)((long)puVar34 + (ulong)(uVar29 & 0xfffffff8)));
            puVar11 = (uint *)tr_median3((int *)puVar16,(int *)(puVar11 + -uVar23),(int *)puVar11,
                                         (int *)(puVar11 + uVar23));
            puVar12 = (uint *)tr_median3((int *)puVar16,
                                         (int *)((long)puVar12 - (ulong)(uVar29 & 0xfffffff8)),
                                         (int *)(puVar12 + -uVar23),(int *)puVar12);
LAB_0017a743:
            local_8f0 = (uint *)tr_median3((int *)puVar16,(int *)puVar10,(int *)puVar11,
                                           (int *)puVar12);
          }
          uVar29 = *puVar34;
          *puVar34 = *local_8f0;
          *local_8f0 = uVar29;
          uVar29 = puVar16[(int)*puVar34];
          tr_partition((int *)puVar16,(int *)puVar34,(int *)(puVar34 + 1),(int *)local_940,
                       (int **)&local_8f0,(int **)&local_8e0,uVar29);
          puVar9 = local_8e0;
          unaff_R15 = local_8f0;
          lVar25 = (long)local_8e0 - (long)local_8f0;
          uVar23 = lVar25 >> 2;
          if (uVar15 == uVar23) {
            iVar5 = trbudget_check(&local_850,iVar27);
            if (iVar5 != 0) {
              iVar5 = tr_ilg(iVar27);
              puVar16 = puVar16 + lVar8;
              goto LAB_00179cab;
            }
            if (-1 < (int)uVar13) {
              stack[uVar13].d = -1;
            }
            if ((int)uVar20 < 0) {
              __assert_fail("0 <= ssize",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xba28,
                            "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                           );
            }
            goto LAB_0017a2f2;
          }
          iVar27 = -1;
          if (puVar28[(int)*local_8f0] != uVar29) {
            iVar27 = tr_ilg((int)uVar23);
          }
          iVar5 = iVar5 + -1;
          for (puVar12 = puVar34; puVar12 < unaff_R15; puVar12 = puVar12 + 1) {
            puVar28[(int)*puVar12] = (int)((ulong)((long)unaff_R15 - (long)SA) >> 2) - 1;
          }
          if (puVar9 < local_940) {
            for (puVar12 = unaff_R15; puVar12 < puVar9; puVar12 = puVar12 + 1) {
              puVar28[(int)*puVar12] = (int)((ulong)((long)puVar9 - (long)SA) >> 2) - 1;
            }
          }
          if (((long)uVar23 < 2) || (iVar31 = trbudget_check(&local_850,(int)uVar23), iVar31 == 0))
          {
            if ((4 < lVar25) && (-1 < (int)uVar13)) {
              stack[uVar13].d = -1;
            }
            lVar25 = (long)unaff_R15 - (long)puVar34 >> 2;
            lVar18 = (long)local_940 - (long)puVar9 >> 2;
            if (lVar18 < lVar25) {
              if (lVar18 < 2) {
                local_940 = unaff_R15;
                if (lVar25 < 2) {
                  if ((int)uVar20 < 0) {
                    __assert_fail("0 <= ssize",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xba1f,
                                  "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                 );
                  }
                  goto LAB_0017a2f2;
                }
              }
              else {
                if (0x3f < (int)uVar20) {
                  __assert_fail("ssize < STACK_SIZE",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xba1a,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                stack[(long)local_8e8].a = (int *)puVar16;
                stack[(long)local_8e8].b = (int *)puVar34;
                stack[(long)local_8e8].c = (int *)unaff_R15;
                stack[(long)local_8e8].d = iVar5;
LAB_0017aa92:
                local_950 = (ulong)(uVar20 + 1);
                stack[(long)local_8e8].e = uVar13;
                puVar34 = puVar9;
              }
            }
            else if (lVar25 < 2) {
              puVar34 = puVar9;
              if (lVar18 < 2) {
                if ((int)uVar20 < 0) {
                  __assert_fail("0 <= ssize",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xba16,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                goto LAB_0017a2f2;
              }
            }
            else {
              if (0x3f < (int)uVar20) {
                __assert_fail("ssize < STACK_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xba11,
                              "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                             );
              }
              stack[(long)local_8e8].a = (int *)puVar16;
              stack[(long)local_8e8].b = (int *)puVar9;
              stack[(long)local_8e8].c = (int *)local_940;
              stack[(long)local_8e8].d = iVar5;
LAB_0017ab17:
              local_950 = (ulong)(uVar20 + 1);
              stack[(long)local_8e8].e = uVar13;
              local_940 = unaff_R15;
            }
            goto LAB_00179cab;
          }
          lVar25 = (long)unaff_R15 - (long)puVar34 >> 2;
          lVar18 = (long)local_940 - (long)puVar9 >> 2;
          if (lVar18 < lVar25) {
            if ((long)uVar23 < lVar25) {
              if (lVar18 <= (long)uVar23) {
                if (lVar18 < 2) {
                  if (0x3f < (int)uVar20) {
                    __assert_fail("ssize < STACK_SIZE",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0xba04,
                                  "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                                 );
                  }
                  stack[(long)local_8e8].a = (int *)puVar16;
                  stack[(long)local_8e8].b = (int *)puVar34;
                  stack[(long)local_8e8].c = (int *)unaff_R15;
                  goto LAB_0017aeb6;
                }
                if (0x3f < (int)uVar20) {
                  __assert_fail("ssize < STACK_SIZE",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xba00,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                stack[(long)local_8e8].a = (int *)puVar16;
                stack[(long)local_8e8].b = (int *)puVar34;
                stack[(long)local_8e8].c = (int *)unaff_R15;
                stack[(long)local_8e8].d = iVar5;
                stack[(long)local_8e8].e = uVar13;
                if (uVar20 == 0x3f) {
                  __assert_fail("ssize < STACK_SIZE",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xba01,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                stack[(long)local_8e8 + 1].a = (int *)(puVar16 + lVar8);
                stack[(long)local_8e8 + 1].b = (int *)unaff_R15;
                stack[(long)local_8e8 + 1].c = (int *)puVar9;
                stack[(long)local_8e8 + 1].d = iVar27;
                local_950 = (ulong)(uVar20 + 2);
                stack[(long)local_8e8 + 1].e = uVar13;
                puVar34 = puVar9;
                goto LAB_00179cab;
              }
              if (0x3f < (int)uVar20) {
                __assert_fail("ssize < STACK_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xba08,
                              "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                             );
              }
              stack[(long)local_8e8].a = (int *)puVar16;
              stack[(long)local_8e8].b = (int *)puVar34;
              stack[(long)local_8e8].c = (int *)unaff_R15;
              stack[(long)local_8e8].d = iVar5;
              stack[(long)local_8e8].e = uVar13;
              if (uVar20 == 0x3f) {
                __assert_fail("ssize < STACK_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xba09,
                              "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                             );
              }
              stack[(long)local_8e8 + 1].a = (int *)puVar16;
              stack[(long)local_8e8 + 1].b = (int *)puVar9;
              stack[(long)local_8e8 + 1].c = (int *)local_940;
LAB_0017abc9:
              stack[(long)local_8e8 + 1].d = iVar5;
              local_950 = (ulong)(uVar20 + 2);
              stack[(long)local_8e8 + 1].e = uVar13;
            }
            else {
              if (1 < lVar18) {
                if (0x3f < (int)uVar20) {
                  __assert_fail("ssize < STACK_SIZE",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xb9f5,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                stack[(long)local_8e8].a = (int *)(puVar16 + lVar8);
                stack[(long)local_8e8].b = (int *)unaff_R15;
                stack[(long)local_8e8].c = (int *)puVar9;
                stack[(long)local_8e8].d = iVar27;
                stack[(long)local_8e8].e = uVar13;
                if (uVar20 == 0x3f) {
                  __assert_fail("ssize < STACK_SIZE",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xb9f6,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                stack[(long)local_8e8 + 1].a = (int *)puVar16;
                stack[(long)local_8e8 + 1].b = (int *)puVar34;
                stack[(long)local_8e8 + 1].c = (int *)unaff_R15;
                stack[(long)local_8e8 + 1].d = iVar5;
                local_950 = (ulong)(uVar20 + 2);
                stack[(long)local_8e8 + 1].e = uVar13;
                puVar34 = puVar9;
                goto LAB_00179cab;
              }
              if (1 < lVar25) {
                if (0x3f < (int)uVar20) {
                  __assert_fail("ssize < STACK_SIZE",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xb9f9,
                                "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                               );
                }
                stack[(long)local_8e8].a = (int *)(puVar16 + lVar8);
                stack[(long)local_8e8].b = (int *)unaff_R15;
                stack[(long)local_8e8].c = (int *)puVar9;
                stack[(long)local_8e8].d = iVar27;
                goto LAB_0017ab17;
              }
            }
          }
          else if ((long)uVar23 < lVar18) {
            if ((long)uVar23 < lVar25) {
              if (0x3f < (int)uVar20) {
                __assert_fail("ssize < STACK_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xb9ee,
                              "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                             );
              }
              stack[(long)local_8e8].a = (int *)puVar16;
              stack[(long)local_8e8].b = (int *)puVar9;
              stack[(long)local_8e8].c = (int *)local_940;
              stack[(long)local_8e8].d = iVar5;
              stack[(long)local_8e8].e = uVar13;
              if (uVar20 == 0x3f) {
                __assert_fail("ssize < STACK_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xb9ef,
                              "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                             );
              }
              stack[(long)local_8e8 + 1].a = (int *)puVar16;
              stack[(long)local_8e8 + 1].b = (int *)puVar34;
              stack[(long)local_8e8 + 1].c = (int *)unaff_R15;
              goto LAB_0017abc9;
            }
            if (1 < lVar25) {
              if (0x3f < (int)uVar20) {
                __assert_fail("ssize < STACK_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xb9e6,
                              "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                             );
              }
              stack[(long)local_8e8].a = (int *)puVar16;
              stack[(long)local_8e8].b = (int *)puVar9;
              stack[(long)local_8e8].c = (int *)local_940;
              stack[(long)local_8e8].d = iVar5;
              stack[(long)local_8e8].e = uVar13;
              if (uVar20 == 0x3f) {
                __assert_fail("ssize < STACK_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xb9e7,
                              "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                             );
              }
              stack[(long)local_8e8 + 1].a = (int *)(puVar16 + lVar8);
              stack[(long)local_8e8 + 1].b = (int *)unaff_R15;
              stack[(long)local_8e8 + 1].c = (int *)puVar9;
              stack[(long)local_8e8 + 1].d = iVar27;
              local_950 = (ulong)(uVar20 + 2);
              stack[(long)local_8e8 + 1].e = uVar13;
              local_940 = unaff_R15;
              goto LAB_00179cab;
            }
            if (0x3f < (int)uVar20) {
              __assert_fail("ssize < STACK_SIZE",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xb9ea,
                            "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                           );
            }
            stack[(long)local_8e8].a = (int *)puVar16;
            stack[(long)local_8e8].b = (int *)puVar9;
            stack[(long)local_8e8].c = (int *)local_940;
LAB_0017aeb6:
            stack[(long)local_8e8].d = iVar5;
            local_950 = (ulong)(uVar20 + 1);
            stack[(long)local_8e8].e = uVar13;
          }
          else {
            if (1 < lVar25) {
              if (0x3f < (int)uVar20) {
                __assert_fail("ssize < STACK_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xb9db,
                              "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                             );
              }
              stack[(long)local_8e8].a = (int *)(puVar16 + lVar8);
              stack[(long)local_8e8].b = (int *)unaff_R15;
              stack[(long)local_8e8].c = (int *)puVar9;
              stack[(long)local_8e8].d = iVar27;
              stack[(long)local_8e8].e = uVar13;
              if (uVar20 == 0x3f) {
                __assert_fail("ssize < STACK_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xb9dc,
                              "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                             );
              }
              stack[(long)local_8e8 + 1].a = (int *)puVar16;
              stack[(long)local_8e8 + 1].b = (int *)puVar9;
              stack[(long)local_8e8 + 1].c = (int *)local_940;
              stack[(long)local_8e8 + 1].d = iVar5;
              local_950 = (ulong)(uVar20 + 2);
              stack[(long)local_8e8 + 1].e = uVar13;
              local_940 = unaff_R15;
              goto LAB_00179cab;
            }
            if (1 < lVar18) {
              if (0x3f < (int)uVar20) {
                __assert_fail("ssize < STACK_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xb9df,
                              "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                             );
              }
              stack[(long)local_8e8].a = (int *)(puVar16 + lVar8);
              stack[(long)local_8e8].b = (int *)unaff_R15;
              stack[(long)local_8e8].c = (int *)puVar9;
              stack[(long)local_8e8].d = iVar27;
              goto LAB_0017aa92;
            }
          }
          puVar16 = puVar16 + lVar8;
          local_940 = puVar9;
          puVar34 = unaff_R15;
          iVar5 = iVar27;
          goto LAB_00179cab;
        }
        uVar23 = (ulong)-(uint)(uVar23 == 4);
      }
      goto LAB_0017af57;
    }
LAB_0017af92:
    bVar32 = T[uVar15];
    puVar9 = local_8c0;
LAB_0017afbd:
    uVar23 = uVar15 & 0xffffffff;
    uVar13 = (uint)uVar15;
    if (-1 < (int)uVar13) {
      uVar22 = 0;
      puVar26 = T;
      do {
        puVar26 = puVar26 + -1;
        uVar15 = 0xffffffffffffffff;
        if (uVar23 == uVar22) goto LAB_0017afbd;
        bVar1 = puVar26[uVar23];
        uVar22 = uVar22 + 1;
        bVar4 = bVar32 <= bVar1;
        bVar32 = bVar1;
      } while (bVar4);
      uVar20 = (uint)uVar22;
      iVar5 = 1;
      for (uVar29 = ~uVar20 + uVar13;
          (bVar32 = bVar1, -1 < (int)uVar29 && (bVar32 = T[uVar29], bVar32 <= bVar1));
          uVar29 = uVar29 - 1) {
        iVar5 = iVar5 + 1;
        bVar1 = bVar32;
      }
      iVar27 = ~uVar13 + uVar20;
      if (1 < iVar5) {
        iVar27 = uVar13 - uVar20;
      }
      if (uVar13 == uVar20) {
        iVar27 = uVar13 - uVar20;
      }
      iVar5 = (int)puVar9;
      puVar9 = (uint *)(ulong)(iVar5 - 1);
      SA[(int)puVar28[(long)iVar5 + -1]] = iVar27;
      uVar15 = (ulong)uVar29;
      goto LAB_0017afbd;
    }
    bucket_B[0xffff] = (int)local_890;
    for (uVar13 = 0xfe; -1 < (int)uVar13; uVar13 = uVar13 - 1) {
      iVar5 = local_888[(ulong)uVar13 + 1] + -1;
      uVar29 = uVar13 << 8;
      for (uVar20 = 0xff; (int)uVar13 < (int)uVar20; uVar20 = uVar20 - 1) {
        uVar7 = uVar20 << 8 | uVar13;
        iVar27 = bucket_B[(int)uVar7];
        bucket_B[(int)uVar7] = iVar5;
        iVar31 = bucket_B[(int)(uVar20 | uVar29)];
        piVar14 = SA + (iVar5 - iVar27);
        iVar5 = iVar5 - iVar27;
        for (local_880 = (ulong)(int)local_880; (long)iVar31 <= (long)local_880;
            local_880 = local_880 - 1) {
          *piVar14 = SA[local_880];
          iVar5 = iVar5 + -1;
          piVar14 = piVar14 + -1;
        }
      }
      bucket_B[(int)(uVar13 + 1 | uVar29)] = (iVar5 - bucket_B[(int)(uVar29 | uVar13)]) + 1;
      bucket_B[(int)(uVar29 | uVar13)] = iVar5;
    }
  }
  return (uint)local_8c0;
LAB_001799c9:
  do {
    uVar20 = *puVar10;
    puVar10 = puVar10 + 1;
    puVar17 = local_958;
    do {
      puVar24 = puVar10;
      puVar24[-1] = *puVar17;
      *puVar17 = *puVar24;
      puVar17 = puVar17 + 1;
      puVar10 = puVar24 + 1;
    } while (puVar17 < puVar11);
    *puVar24 = uVar20;
    uVar20 = (int)uVar22 + ~uVar7;
    uVar22 = (ulong)uVar20;
  } while ((int)uVar7 < (int)uVar20);
  goto LAB_00179979;
LAB_00179eb5:
  if (iVar5 == -2) {
    unaff_R15 = *(uint **)(&local_850 + (long)puVar30 * 2);
    puVar9 = *(uint **)&(&local_850)[(long)puVar30 * 2].incval;
    if (stack[(long)puVar30 + -1].d == 0) {
      uVar13 = (int)((ulong)((long)puVar9 - (long)SA) >> 2) - 1;
      puVar12 = unaff_R15 + -1;
      for (; iVar5 = (int)((ulong)((long)puVar16 - (long)puVar28) >> 2), puVar34 <= puVar12;
          puVar34 = puVar34 + 1) {
        uVar29 = *puVar34 - iVar5;
        if ((-1 < (int)uVar29) && (puVar28[uVar29] == uVar13)) {
          puVar12[1] = uVar29;
          puVar12 = puVar12 + 1;
          puVar28[uVar29] = (uint)((ulong)((long)puVar12 - (long)SA) >> 2);
        }
      }
      puVar16 = puVar9;
      while (local_940 = local_940 + -1, puVar12 + 1 < puVar16) {
        uVar29 = *local_940 - iVar5;
        if ((-1 < (int)uVar29) && (puVar28[uVar29] == uVar13)) {
          puVar16[-1] = uVar29;
          puVar16 = puVar16 + -1;
          puVar28[uVar29] = (uint)((ulong)((long)puVar16 - (long)SA) >> 2);
        }
      }
    }
    else {
      if (-1 < (int)uVar13) {
        stack[uVar13].d = -1;
      }
      uVar29 = (int)((ulong)((long)puVar9 - (long)SA) >> 2) - 1;
      puVar12 = unaff_R15 + -1;
      uVar15 = 0xffffffffffffffff;
      uVar13 = 0xffffffff;
      for (puVar30 = puVar34; iVar5 = (int)((ulong)((long)puVar16 - (long)puVar28) >> 2),
          puVar30 <= puVar12; puVar30 = puVar30 + 1) {
        uVar7 = *puVar30;
        uVar6 = uVar7 - iVar5;
        if ((-1 < (int)uVar6) && (puVar28[uVar6] == uVar29)) {
          puVar12[1] = uVar6;
          puVar12 = puVar12 + 1;
          uVar7 = puVar28[(int)uVar7];
          uVar3 = (uint)((ulong)((long)puVar12 - (long)SA) >> 2);
          if (uVar13 == uVar7) {
            uVar3 = (uint)uVar15;
          }
          puVar28[uVar6] = uVar3;
          uVar15 = (ulong)uVar3;
          uVar13 = uVar7;
        }
      }
      uVar23 = local_8d0 + (long)puVar12;
      uVar13 = 0xffffffff;
      for (puVar16 = puVar12; puVar34 <= puVar16; puVar16 = puVar16 + -1) {
        uVar7 = puVar28[(int)*puVar16];
        uVar22 = uVar15;
        if (uVar13 != uVar7) {
          uVar22 = uVar23 >> 2;
        }
        uVar15 = uVar22 & 0xffffffff;
        if ((uint)uVar22 != uVar7) {
          puVar28[(int)*puVar16] = (uint)uVar22;
        }
        uVar23 = uVar23 - 4;
        uVar13 = uVar7;
      }
      puVar16 = puVar9;
      uVar13 = 0xffffffff;
      while (local_940 = local_940 + -1, puVar12 + 1 < puVar16) {
        uVar7 = *local_940;
        uVar6 = uVar7 - iVar5;
        if ((-1 < (int)uVar6) && (puVar28[uVar6] == uVar29)) {
          puVar16[-1] = uVar6;
          puVar16 = puVar16 + -1;
          uVar7 = puVar28[(int)uVar7];
          uVar23 = uVar15;
          if (uVar13 != uVar7) {
            uVar23 = (ulong)((long)puVar16 - (long)SA) >> 2;
          }
          uVar15 = uVar23 & 0xffffffff;
          puVar28[uVar6] = (uint)uVar23;
          uVar13 = uVar7;
        }
      }
    }
    local_8f0 = unaff_R15;
    local_8e0 = puVar9;
    if ((int)uVar20 < 1) {
      __assert_fail("0 <= ssize",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xb990,
                    "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)");
    }
    if (uVar20 == 1) goto LAB_0017aefd;
    uVar20 = uVar20 - 2;
  }
  else {
    if (iVar5 == -1) {
      puVar12 = puVar16 + local_868;
      local_8f0 = unaff_R15;
      local_8e0 = puVar9;
      tr_partition((int *)puVar12,(int *)puVar34,(int *)puVar34,(int *)local_940,(int **)&local_8f0,
                   (int **)&local_8e0,(int)((ulong)((long)local_940 - (long)SA) >> 2) + -1);
      puVar9 = local_8e0;
      unaff_R15 = local_8f0;
      if (local_8f0 < local_940) {
        for (puVar11 = puVar34; puVar11 < local_8f0; puVar11 = puVar11 + 1) {
          puVar28[(int)*puVar11] = (int)((ulong)((long)local_8f0 - (long)SA) >> 2) - 1;
        }
      }
      if (local_8e0 < local_940) {
        for (puVar11 = local_8f0; puVar11 < local_8e0; puVar11 = puVar11 + 1) {
          puVar28[(int)*puVar11] = (int)((ulong)((long)local_8e0 - (long)SA) >> 2) - 1;
        }
      }
      if (4 < (long)local_8e0 - (long)local_8f0) {
        if (0x3f < (int)uVar20) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb970,
                        "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)");
        }
        stack[(long)puVar30].a = (int *)0x0;
        stack[(long)puVar30].b = (int *)local_8f0;
        stack[(long)puVar30].c = (int *)local_8e0;
        stack[(long)puVar30].d = 0;
        stack[(long)puVar30].e = 0;
        if (uVar20 == 0x3f) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb971,
                        "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)");
        }
        stack[(long)puVar30 + 1].a = (int *)puVar12;
        stack[(long)puVar30 + 1].b = (int *)puVar34;
        stack[(long)puVar30 + 1].c = (int *)local_940;
        stack[(long)puVar30 + 1].d = -2;
        local_950 = (ulong)(uVar20 + 2);
        stack[(long)puVar30 + 1].e = uVar13;
        uVar13 = uVar20;
      }
      uVar15 = (long)local_8f0 - (long)puVar34;
      lVar18 = (long)uVar15 >> 2;
      uVar23 = (long)local_940 - (long)local_8e0;
      lVar25 = (long)uVar23 >> 2;
      iVar27 = (int)local_950;
      if (lVar25 < lVar18) {
        if (lVar25 < 2) {
          if (1 < lVar18) {
            iVar5 = tr_ilg((int)lVar18);
            local_940 = unaff_R15;
            goto LAB_00179cab;
          }
          if (iVar27 < 0) {
            __assert_fail("0 <= ssize",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb984,
                          "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                         );
          }
LAB_0017a63a:
          if (iVar27 == 0) goto LAB_0017aefd;
          local_950 = (ulong)(iVar27 - 1);
          puVar16 = (uint *)stack[local_950].a;
          iVar5 = stack[local_950].d;
          uVar13 = stack[local_950].e;
          local_940 = (uint *)stack[local_950].c;
          puVar34 = (uint *)stack[local_950].b;
          goto LAB_00179cab;
        }
        if (0x3f < iVar27) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb97f,
                        "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)");
        }
        stack[iVar27].a = (int *)puVar16;
        stack[iVar27].b = (int *)puVar34;
        stack[iVar27].c = (int *)local_8f0;
        iVar5 = tr_ilg((int)(uVar15 >> 2));
        stack[iVar27].d = iVar5;
        stack[iVar27].e = uVar13;
        iVar5 = tr_ilg((int)(uVar23 >> 2));
        puVar34 = puVar9;
      }
      else {
        if (lVar18 < 2) {
          if (1 < lVar25) {
            iVar5 = tr_ilg((int)lVar25);
            puVar34 = puVar9;
            goto LAB_00179cab;
          }
          if (iVar27 < 0) {
            __assert_fail("0 <= ssize",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb97b,
                          "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                         );
          }
          goto LAB_0017a63a;
        }
        if (0x3f < iVar27) {
          __assert_fail("ssize < STACK_SIZE",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xb976,
                        "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)");
        }
        stack[iVar27].a = (int *)puVar16;
        stack[iVar27].b = (int *)local_8e0;
        stack[iVar27].c = (int *)local_940;
        iVar5 = tr_ilg((int)(uVar23 >> 2));
        stack[iVar27].d = iVar5;
        stack[iVar27].e = uVar13;
        iVar5 = tr_ilg((int)(uVar15 >> 2));
        local_940 = unaff_R15;
      }
      local_950 = (ulong)(iVar27 + 1);
      goto LAB_00179cab;
    }
    uVar29 = *puVar34;
    if (-1 < (int)uVar29) {
      uVar15 = local_8d0 + (long)puVar34;
      do {
        puVar34 = puVar34 + 1;
        puVar28[uVar29] = (uint)(uVar15 >> 2);
        unaff_R15 = puVar34;
        if (local_940 <= puVar34) break;
        uVar29 = *puVar34;
        uVar15 = uVar15 + 4;
      } while (-1 < (int)uVar29);
    }
    local_8f0 = unaff_R15;
    if (puVar34 < local_940) {
      uVar23 = (ulong)*puVar34;
      uVar15 = 4;
      do {
        uVar22 = uVar15;
        *(uint *)((long)puVar34 + (uVar22 - 4)) = ~(uint)uVar23;
        uVar23 = (ulong)*(int *)((long)puVar34 + uVar22);
        uVar15 = uVar22 + 4;
      } while ((long)uVar23 < 0);
      iVar5 = -1;
      local_8e8 = puVar30;
      local_8e0 = puVar9;
      if (puVar28[uVar23] != puVar16[uVar23]) {
        iVar5 = tr_ilg((int)(uVar22 >> 2) + 1);
      }
      unaff_R15 = (uint *)((long)puVar34 + uVar15);
      if (unaff_R15 < local_940) {
        for (puVar9 = puVar34; local_8e0 = puVar9, puVar9 < unaff_R15; puVar9 = puVar9 + 1) {
          puVar28[(int)*puVar9] = (int)((long)puVar34 + uVar15 + local_8d0 >> 2) - 1;
        }
      }
      local_8f0 = unaff_R15;
      iVar27 = trbudget_check(&local_850,(int)(uVar15 >> 2));
      if (iVar27 != 0) {
        lVar25 = (long)local_940 + (-uVar15 - (long)puVar34);
        if (lVar25 < (long)uVar15) {
          if (4 < lVar25) {
            if (0x3f < (int)uVar20) {
              __assert_fail("ssize < STACK_SIZE",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xb9a4,
                            "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                           );
            }
            stack[(long)local_8e8].a = (int *)(puVar16 + lVar8);
            stack[(long)local_8e8].b = (int *)puVar34;
            stack[(long)local_8e8].c = (int *)unaff_R15;
            stack[(long)local_8e8].d = iVar5;
            local_950 = (ulong)(uVar20 + 1);
            stack[(long)local_8e8].e = uVar13;
            iVar5 = -3;
            puVar34 = unaff_R15;
            goto LAB_00179cab;
          }
        }
        else {
          if (0x3f < (int)uVar20) {
            __assert_fail("ssize < STACK_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xb9a0,
                          "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)"
                         );
          }
          stack[(long)local_8e8].a = (int *)puVar16;
          stack[(long)local_8e8].b = (int *)unaff_R15;
          stack[(long)local_8e8].c = (int *)local_940;
          stack[(long)local_8e8].d = -3;
          local_950 = (ulong)(uVar20 + 1);
          stack[(long)local_8e8].e = uVar13;
        }
        puVar16 = puVar16 + lVar8;
        local_940 = unaff_R15;
        goto LAB_00179cab;
      }
      if (-1 < (int)uVar13) {
        stack[uVar13].d = -1;
      }
      lVar25 = -uVar15 - (long)puVar34;
      iVar5 = -3;
      puVar34 = unaff_R15;
      if (4 < (long)local_940 + lVar25) goto LAB_00179cab;
      if ((int)uVar20 < 0) {
        __assert_fail("0 <= ssize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xb9af,
                      "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)");
      }
    }
    else {
      local_8e0 = puVar9;
      if ((int)uVar20 < 0) {
        __assert_fail("0 <= ssize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xb9b3,
                      "void tr_introsort(int *, const int *, int *, int *, int *, trbudget_t *)");
      }
    }
LAB_0017a2f2:
    if (uVar20 == 0) goto LAB_0017aefd;
    uVar20 = uVar20 - 1;
  }
  local_950 = (ulong)uVar20;
  puVar16 = (uint *)stack[local_950].a;
  uVar13 = stack[local_950].e;
  local_940 = (uint *)stack[local_950].c;
  puVar34 = (uint *)stack[local_950].b;
  iVar5 = stack[local_950].d;
  goto LAB_00179cab;
LAB_00179d2a:
  while (puVar30 = puVar11 + 1, puVar30 < local_940) {
    uVar20 = *puVar11;
    uVar7 = puVar11[1];
    while( true ) {
      uVar6 = puVar16[(int)uVar7];
      uVar3 = puVar16[(int)uVar20];
      puVar10 = puVar11;
      if ((int)uVar3 <= (int)uVar6) break;
      do {
        puVar11 = puVar10 + -1;
        puVar10[1] = uVar20;
        if (puVar11 < puVar34) goto LAB_00179d67;
        uVar20 = *puVar11;
        puVar10 = puVar11;
      } while ((int)uVar20 < 0);
    }
LAB_00179d67:
    if (uVar6 == uVar3) {
      *puVar11 = ~*puVar11;
    }
    puVar11[1] = uVar7;
    puVar11 = puVar30;
  }
  iVar5 = -3;
  goto LAB_00179d11;
LAB_0017aefd:
  piVar14 = local_858;
  uVar15 = local_8b0;
  if (local_850.count == 0) {
    uVar23 = (ulong)((long)local_870 - (long)local_8d8) >> 2;
    local_940 = local_8d8;
LAB_0017af57:
    puVar9 = local_940;
    if (puVar28 <= local_940) {
      uVar13 = (uint)uVar23;
      if (uVar13 != 0) {
        local_940[(int)uVar13] = uVar13;
      }
LAB_0017af73:
      if (local_894 == 0) goto LAB_0017af92;
      local_8b8 = (uint *)((long)local_8b8 + local_840);
      goto LAB_00179bf9;
    }
  }
  else {
    local_894 = local_894 + local_850.count;
    uVar23 = 0;
    puVar9 = local_8d8;
    if (puVar28 <= local_8d8) goto LAB_0017af73;
  }
  uVar13 = *puVar9;
  goto LAB_00179c44;
}

Assistant:

static
int
sort_typeBstar(const unsigned char *T, int *SA,
               int *bucket_A, int *bucket_B,
               int n, int openMP) {
  int *PAb, *ISAb, *buf;
#ifdef LIBBSC_OPENMP
  int *curbuf;
  int l;
#endif
  int i, j, k, t, m, bufsize;
  int c0, c1;
#ifdef LIBBSC_OPENMP
  int d0, d1;
#endif
  (void)openMP;

  /* Initialize bucket arrays. */
  for(i = 0; i < BUCKET_A_SIZE; ++i) { bucket_A[i] = 0; }
  for(i = 0; i < BUCKET_B_SIZE; ++i) { bucket_B[i] = 0; }

  /* Count the number of occurrences of the first one or two characters of each
     type A, B and B* suffix. Moreover, store the beginning position of all
     type B* suffixes into the array SA. */
  for(i = n - 1, m = n, c0 = T[n - 1]; 0 <= i;) {
    /* type A suffix. */
    do { ++BUCKET_A(c1 = c0); } while((0 <= --i) && ((c0 = T[i]) >= c1));
    if(0 <= i) {
      /* type B* suffix. */
      ++BUCKET_BSTAR(c0, c1);
      SA[--m] = i;
      /* type B suffix. */
      for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) <= c1); --i, c1 = c0) {
        ++BUCKET_B(c0, c1);
      }
    }
  }
  m = n - m;
/*
note:
  A type B* suffix is lexicographically smaller than a type B suffix that
  begins with the same first two characters.
*/

  /* Calculate the index of start/end point of each bucket. */
  for(c0 = 0, i = 0, j = 0; c0 < ALPHABET_SIZE; ++c0) {
    t = i + BUCKET_A(c0);
    BUCKET_A(c0) = i + j; /* start point */
    i = t + BUCKET_B(c0, c0);
    for(c1 = c0 + 1; c1 < ALPHABET_SIZE; ++c1) {
      j += BUCKET_BSTAR(c0, c1);
      BUCKET_BSTAR(c0, c1) = j; /* end point */
      i += BUCKET_B(c0, c1);
    }
  }

  if(0 < m) {
    /* Sort the type B* suffixes by their first two characters. */
    PAb = SA + n - m; ISAb = SA + m;
    for(i = m - 2; 0 <= i; --i) {
      t = PAb[i], c0 = T[t], c1 = T[t + 1];
      SA[--BUCKET_BSTAR(c0, c1)] = i;
    }
    t = PAb[m - 1], c0 = T[t], c1 = T[t + 1];
    SA[--BUCKET_BSTAR(c0, c1)] = m - 1;

    /* Sort the type B* substrings using sssort. */
#ifdef LIBBSC_OPENMP
    if (openMP)
    {
        buf = SA + m;
        c0 = ALPHABET_SIZE - 2, c1 = ALPHABET_SIZE - 1, j = m;
#pragma omp parallel default(shared) private(bufsize, curbuf, k, l, d0, d1)
        {
          bufsize = (n - (2 * m)) / omp_get_num_threads();
          curbuf = buf + omp_get_thread_num() * bufsize;
          k = 0;
          for(;;) {
            #pragma omp critical(sssort_lock)
            {
              if(0 < (l = j)) {
                d0 = c0, d1 = c1;
                do {
                  k = BUCKET_BSTAR(d0, d1);
                  if(--d1 <= d0) {
                    d1 = ALPHABET_SIZE - 1;
                    if(--d0 < 0) { break; }
                  }
                } while(((l - k) <= 1) && (0 < (l = k)));
                c0 = d0, c1 = d1, j = k;
              }
            }
            if(l == 0) { break; }
            sssort(T, PAb, SA + k, SA + l,
                   curbuf, bufsize, 2, n, *(SA + k) == (m - 1));
          }
        }
    }
    else
    {
        buf = SA + m, bufsize = n - (2 * m);
        for(c0 = ALPHABET_SIZE - 2, j = m; 0 < j; --c0) {
          for(c1 = ALPHABET_SIZE - 1; c0 < c1; j = i, --c1) {
            i = BUCKET_BSTAR(c0, c1);
            if(1 < (j - i)) {
              sssort(T, PAb, SA + i, SA + j,
                     buf, bufsize, 2, n, *(SA + i) == (m - 1));
            }
          }
        }
    }
#else
    buf = SA + m, bufsize = n - (2 * m);
    for(c0 = ALPHABET_SIZE - 2, j = m; 0 < j; --c0) {
      for(c1 = ALPHABET_SIZE - 1; c0 < c1; j = i, --c1) {
        i = BUCKET_BSTAR(c0, c1);
        if(1 < (j - i)) {
          sssort(T, PAb, SA + i, SA + j,
                 buf, bufsize, 2, n, *(SA + i) == (m - 1));
        }
      }
    }
#endif

    /* Compute ranks of type B* substrings. */
    for(i = m - 1; 0 <= i; --i) {
      if(0 <= SA[i]) {
        j = i;
        do { ISAb[SA[i]] = i; } while((0 <= --i) && (0 <= SA[i]));
        SA[i + 1] = i - j;
        if(i <= 0) { break; }
      }
      j = i;
      do { ISAb[SA[i] = ~SA[i]] = j; } while(SA[--i] < 0);
      ISAb[SA[i]] = j;
    }

    /* Construct the inverse suffix array of type B* suffixes using trsort. */
    trsort(ISAb, SA, m, 1);

    /* Set the sorted order of type B* suffixes. */
    for(i = n - 1, j = m, c0 = T[n - 1]; 0 <= i;) {
      for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) >= c1); --i, c1 = c0) { }
      if(0 <= i) {
        t = i;
        for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) <= c1); --i, c1 = c0) { }
        SA[ISAb[--j]] = ((t == 0) || (1 < (t - i))) ? t : ~t;
      }
    }

    /* Calculate the index of start/end point of each bucket. */
    BUCKET_B(ALPHABET_SIZE - 1, ALPHABET_SIZE - 1) = n; /* end point */
    for(c0 = ALPHABET_SIZE - 2, k = m - 1; 0 <= c0; --c0) {
      i = BUCKET_A(c0 + 1) - 1;
      for(c1 = ALPHABET_SIZE - 1; c0 < c1; --c1) {
        t = i - BUCKET_B(c0, c1);
        BUCKET_B(c0, c1) = i; /* end point */

        /* Move all type B* suffixes to the correct position. */
        for(i = t, j = BUCKET_BSTAR(c0, c1);
            j <= k;
            --i, --k) { SA[i] = SA[k]; }
      }
      BUCKET_BSTAR(c0, c0 + 1) = i - BUCKET_B(c0, c0) + 1; /* start point */
      BUCKET_B(c0, c0) = i; /* end point */
    }
  }

  return m;
}